

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O2

vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *
__thiscall
libtorrent::aux::piece_picker::get_downloaders
          (vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           *__return_storage_ptr__,piece_picker *this,piece_index_t index)

{
  download_queue_t queue;
  uint uVar1;
  iterator dp;
  block_info *__x;
  ulong uVar2;
  bool bVar3;
  span<libtorrent::aux::piece_picker::block_info> sVar4;
  value_type local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  queue = piece_pos::download_queue
                    ((this->m_piece_map).
                     super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     .
                     super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                     ._M_impl.super__Vector_impl_data._M_start + index.m_val);
  uVar1 = blocks_in_piece(this,index);
  ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  reserve(__return_storage_ptr__,(long)(int)uVar1);
  if (queue.m_val == '\x04') {
    local_38 = (value_type)0x0;
    ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::resize(__return_storage_ptr__,(long)(int)uVar1,&local_38);
  }
  else {
    dp = find_dl_piece(this,queue,index);
    sVar4 = mutable_blocks_for_piece(this,dp._M_current);
    __x = sVar4.m_ptr;
    uVar2 = (ulong)uVar1;
    while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
      ::std::
      vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      push_back(__return_storage_ptr__,&__x->peer);
      __x = __x + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<aux::torrent_peer*> piece_picker::get_downloaders(piece_index_t const index) const
	{
		std::vector<aux::torrent_peer*> d;
		auto const state = m_piece_map[index].download_queue();
		int const num_blocks = blocks_in_piece(index);
		d.reserve(aux::numeric_cast<std::size_t>(num_blocks));

		if (state == piece_pos::piece_open)
		{
			d.resize(std::size_t(num_blocks), nullptr);
			return d;
		}

		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		auto const binfo = blocks_for_piece(*i);
		for (int j = 0; j != num_blocks; ++j)
		{
			TORRENT_ASSERT(binfo[j].peer == nullptr
				|| binfo[j].peer->in_use);
			d.push_back(binfo[j].peer);
		}
		return d;
	}